

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

void __thiscall Thread::Start(Thread *this)

{
  function<void_()> *this_00;
  function<void_()> local_30;
  
  if (this->m_bStarted == false) {
    this_00 = (function<void_()> *)operator_new(0x20);
    std::function<void_()>::function(&local_30,&this->m_func);
    std::function<void_()>::function(this_00,&local_30);
    std::_Function_base::~_Function_base(&local_30.super__Function_base);
    pthread_create(&this->m_pthreadId,(pthread_attr_t *)0x0,ThreadRun,this_00);
    this->m_bStarted = true;
  }
  return;
}

Assistant:

void Thread::Start()
{
	if (!m_bStarted)
	{
		ThreadData * ptData = new ThreadData(m_func);
		pthread_create(&m_pthreadId, NULL, ThreadRun, static_cast<void *> (ptData));
		m_bStarted = true;
	}
}